

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transition.cc
# Opt level: O1

void __thiscall
transition_invoke_action_se_Test::~transition_invoke_action_se_Test
          (transition_invoke_action_se_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(transition, invoke_action_se) {
    auto transition = make_transition(
        state<s1>, event<e1>, _, [](s1&, e1&) { return s2{}; }, state<s2>);


    auto s = s1{};
    auto e = e1{};

    static_assert(std::is_same<decltype(transition.action(s, e)), s2>::value, "");
    static_assert(std::is_same<decltype(transition.invoke_action(s, e)), s2>::value, "");
}